

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

size_t __thiscall Server::loadToxFileSize(Server *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  undefined1 local_2b0 [16];
  Server *local_2a0;
  size_t fileSize;
  string local_290 [48];
  undefined1 local_260 [64];
  pointer local_220;
  ifstream loadFile;
  Server *this_local;
  
  getDataDir_abi_cxx11_((Server *)local_260);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_260 + 0x20),(char *)local_260);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_220,(string *)(local_260 + 0x20),_Var2);
  std::__cxx11::string::~string((string *)(local_260 + 0x20));
  std::__cxx11::string::~string((string *)local_260);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::seekg((long)&local_220,_S_beg);
    local_2b0 = std::istream::tellg();
    local_2a0 = (Server *)std::fpos::operator_cast_to_long((fpos *)local_2b0);
    std::ifstream::close();
    this_local = local_2a0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_290,"Failed to open tox id file for loading",(allocator *)((long)&fileSize + 7)
              );
    writeToLog(this,(string *)local_290);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fileSize + 7));
    this_local = (Server *)0xffffffffffffffff;
  }
  fileSize._0_4_ = 1;
  std::ifstream::~ifstream(&local_220);
  return (size_t)this_local;
}

Assistant:

size_t Server::loadToxFileSize() {
    ifstream loadFile(getDataDir() + "profile_000.tox", ios_base::in | ios_base::binary);

    if (!loadFile) {
        writeToLog("Failed to open tox id file for loading");
        return -1;
    }

    loadFile.seekg(0, ios::end);
    size_t fileSize = loadFile.tellg();

    loadFile.close();

    return fileSize;
}